

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<Qt::Key>::relocate(QArrayDataPointer<Qt::Key> *this,qsizetype offset,Key **data)

{
  Key *d_first;
  Key *pKVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<Qt::Key,long_long>(this->ptr,this->size,d_first);
  if (data != (Key **)0x0) {
    pKVar1 = *data;
    if ((this->ptr <= pKVar1) && (pKVar1 < this->ptr + this->size)) {
      *data = pKVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }